

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O1

void ncnn::conv3x3s1_winograd43_transform_kernel_sse
               (Mat *kernel,Mat *kernel_tm2,int inch,int outch,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  int *piVar13;
  int i;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  Allocator *pAVar18;
  uint uVar19;
  ulong uVar20;
  Allocator *pAVar21;
  ulong uVar22;
  void *pvVar23;
  ulong uVar24;
  uint uVar25;
  Allocator *pAVar26;
  undefined8 *puVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float tmp [6] [3];
  Mat local_c8;
  void *local_80;
  float fStack_78;
  undefined8 auStack_74 [8];
  
  uVar29 = (ulong)(uint)outch;
  local_c8.cstep = 0;
  local_c8.data = (Allocator *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elempack = 0;
  local_c8._48_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_c8.elemsize._4_4_ = (int)local_c8.refcount;
  local_c8.allocator = (Allocator *)local_c8.data;
  local_c8.dims = (int)local_c8.refcount;
  local_c8.w = local_c8.refcount._4_4_;
  local_c8.c = local_c8.elempack;
  Mat::create(&local_c8,0x24,inch,outch,4,(Allocator *)0x0);
  uVar20 = (ulong)(uint)inch;
  if (0 < outch) {
    local_80 = kernel->data;
    uVar24 = 0;
    pAVar18 = (Allocator *)local_c8.data;
    do {
      if (0 < inch) {
        iVar14 = inch * 9 * (int)uVar24;
        uVar30 = 0;
        pAVar21 = pAVar18;
        do {
          fVar1 = *(float *)((long)local_80 + uVar30 * 0x24 + (long)iVar14 * 4 + 0x18);
          fVar2 = *(float *)((long)local_80 + uVar30 * 0x24 + (long)iVar14 * 4 + 0x1c);
          fVar3 = *(float *)((long)local_80 + uVar30 * 0x24 + (long)iVar14 * 4 + 0x20);
          auVar9 = vinsertps_avx(ZEXT416(*(uint *)((long)local_80 + uVar30 * 0x24 + (long)iVar14 * 4
                                                  )),
                                 ZEXT416(*(uint *)((long)local_80 +
                                                  uVar30 * 0x24 + (long)iVar14 * 4 + 0x10)),0x10);
          auVar32 = vinsertps_avx(ZEXT416(*(uint *)((long)local_80 +
                                                   uVar30 * 0x24 + (long)iVar14 * 4 + 0xc)),
                                  ZEXT416(*(uint *)((long)local_80 +
                                                   uVar30 * 0x24 + (long)iVar14 * 4 + 4)),0x10);
          auVar10 = vinsertps_avx(ZEXT416(*(uint *)((long)local_80 +
                                                   uVar30 * 0x24 + (long)iVar14 * 4 + 8)),
                                  ZEXT416(*(uint *)((long)local_80 +
                                                   uVar30 * 0x24 + (long)iVar14 * 4 + 0x14)),0x10);
          lVar17 = 8;
          do {
            uVar22 = *(ulong *)((long)&DAT_0054d468 + lVar17);
            auVar33._8_8_ = 0;
            auVar33._0_8_ = uVar22;
            fVar11 = (float)uVar22;
            auVar34._0_4_ = auVar32._0_4_ * fVar11;
            fVar12 = (float)(uVar22 >> 0x20);
            auVar34._4_4_ = auVar32._4_4_ * fVar12;
            auVar34._8_4_ = auVar32._8_4_ * 0.0;
            auVar34._12_4_ = auVar32._12_4_ * 0.0;
            auVar34 = vshufps_avx(auVar34,auVar34,0xe1);
            fVar4 = *(float *)((long)&DAT_0054d470 + lVar17);
            auVar35._0_4_ = auVar9._0_4_ * fVar11 + fVar4 * auVar10._0_4_ + auVar34._0_4_;
            auVar35._4_4_ = auVar9._4_4_ * fVar12 + fVar4 * auVar10._4_4_ + auVar34._4_4_;
            auVar35._8_4_ = auVar9._8_4_ * 0.0 + fVar4 * auVar10._8_4_ + auVar34._8_4_;
            auVar35._12_4_ = auVar9._12_4_ * 0.0 + fVar4 * auVar10._12_4_ + auVar34._12_4_;
            uVar5 = vmovlps_avx(auVar35);
            *(undefined8 *)((long)&local_80 + lVar17) = uVar5;
            auVar34 = vmovshdup_avx(auVar33);
            *(float *)((long)auStack_74 + lVar17 + -4) =
                 fVar2 * auVar34._0_4_ + fVar4 * fVar3 + fVar1 * fVar11;
            lVar17 = lVar17 + 0xc;
          } while (lVar17 != 0x50);
          lVar17 = 0;
          pAVar26 = pAVar21;
          do {
            fVar1 = *(float *)((long)auStack_74 + lVar17 * 0xc + -4);
            uVar5 = *(undefined8 *)((long)auStack_74 + lVar17 * 0xc);
            puVar27 = (undefined8 *)((long)&DAT_0054d470 + 4);
            lVar15 = 0;
            do {
              auVar32._0_4_ = (float)*puVar27 * (float)uVar5;
              auVar32._4_4_ = (float)((ulong)*puVar27 >> 0x20) * (float)((ulong)uVar5 >> 0x20);
              auVar32._8_8_ = 0;
              auVar9 = vmovshdup_avx(auVar32);
              *(float *)((long)&pAVar26->_vptr_Allocator + lVar15 * 4) =
                   auVar32._0_4_ + fVar1 * *(float *)((long)puVar27 + -4) + auVar9._0_4_;
              lVar15 = lVar15 + 1;
              puVar27 = (undefined8 *)((long)puVar27 + 0xc);
            } while (lVar15 != 6);
            lVar17 = lVar17 + 1;
            pAVar26 = pAVar26 + 3;
          } while (lVar17 != 6);
          uVar30 = uVar30 + 1;
          pAVar21 = (Allocator *)
                    ((long)&pAVar21->_vptr_Allocator +
                    (long)local_c8.w *
                    CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
        } while (uVar30 != uVar20);
      }
      uVar24 = uVar24 + 1;
      pAVar18 = (Allocator *)
                ((long)&pAVar18->_vptr_Allocator +
                local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
    } while (uVar24 != uVar29);
  }
  uVar19 = outch + 3;
  uVar25 = outch + 7;
  if (-1 < outch) {
    uVar19 = outch;
    uVar25 = outch;
  }
  iVar16 = outch - (uVar25 & 0xfffffff8);
  iVar14 = (outch - (uVar25 & 0xfffffff8)) + 3;
  if (-1 < iVar16) {
    iVar14 = iVar16;
  }
  uVar24 = 0;
  Mat::create(kernel_tm2,inch * 8,0x24,
              (outch - (uVar19 & 0xfffffffc)) + ((int)uVar25 >> 3) + (iVar14 >> 2),4,
              (Allocator *)0x0);
  if (7 < outch) {
    iVar14 = kernel_tm2->w;
    pvVar6 = kernel_tm2->data;
    sVar7 = kernel_tm2->elemsize;
    sVar8 = kernel_tm2->cstep;
    uVar30 = uVar24;
    do {
      lVar17 = local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
      pAVar18 = (Allocator *)((long)(_func_int ***)local_c8.data + lVar17 * uVar30);
      lVar15 = 0;
      do {
        if (0 < inch) {
          lVar31 = (long)pvVar6 + (long)iVar14 * sVar7 * lVar15 + (uVar30 >> 3) * sVar8 * sVar7;
          uVar24 = 0;
          pAVar21 = pAVar18;
          do {
            lVar28 = 0;
            pAVar26 = pAVar21;
            do {
              *(undefined4 *)(lVar31 + lVar28) = *(undefined4 *)&pAVar26->_vptr_Allocator;
              pAVar26 = (Allocator *)((long)&pAVar26->_vptr_Allocator + lVar17);
              lVar28 = lVar28 + 4;
            } while (lVar28 != 0x20);
            uVar24 = uVar24 + 1;
            pAVar21 = (Allocator *)
                      ((long)&pAVar21->_vptr_Allocator +
                      (long)local_c8.w *
                      CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
            lVar31 = lVar31 + 0x20;
          } while (uVar24 != uVar20);
        }
        lVar15 = lVar15 + 1;
        pAVar18 = (Allocator *)((long)&pAVar18->_vptr_Allocator + 4);
      } while (lVar15 != 0x24);
      uVar24 = uVar30 + 8;
      uVar22 = uVar30 + 0xf;
      uVar30 = uVar24;
    } while (uVar22 < uVar29);
  }
  if ((int)((uint)uVar24 | 3) < outch) {
    iVar14 = kernel_tm2->w;
    pvVar6 = kernel_tm2->data;
    sVar7 = kernel_tm2->elemsize;
    sVar8 = kernel_tm2->cstep;
    uVar24 = uVar24 & 0xffffffff;
    do {
      lVar17 = local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
      pAVar18 = (Allocator *)((long)(_func_int ***)local_c8.data + lVar17 * uVar24);
      lVar15 = 0;
      do {
        if (0 < inch) {
          lVar31 = (long)pvVar6 +
                   (long)iVar14 * sVar7 * lVar15 +
                   (ulong)(((uint)(uVar24 >> 3) & 0x1fffffff) + (uint)(((uint)uVar24 >> 2 & 1) != 0)
                          ) * sVar8 * sVar7;
          uVar30 = 0;
          pAVar21 = pAVar18;
          do {
            lVar28 = 0;
            pAVar26 = pAVar21;
            do {
              *(undefined4 *)(lVar31 + lVar28) = *(undefined4 *)&pAVar26->_vptr_Allocator;
              pAVar26 = (Allocator *)((long)&pAVar26->_vptr_Allocator + lVar17);
              lVar28 = lVar28 + 4;
            } while (lVar28 != 0x10);
            uVar30 = uVar30 + 1;
            pAVar21 = (Allocator *)
                      ((long)&pAVar21->_vptr_Allocator +
                      (long)local_c8.w *
                      CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
            lVar31 = lVar31 + 0x10;
          } while (uVar30 != uVar20);
        }
        lVar15 = lVar15 + 1;
        pAVar18 = (Allocator *)((long)&pAVar18->_vptr_Allocator + 4);
      } while (lVar15 != 0x24);
      uVar24 = uVar24 + 4;
    } while ((int)((uint)uVar24 | 3) < outch);
  }
  if ((int)uVar24 < outch) {
    iVar14 = kernel_tm2->w;
    pvVar6 = kernel_tm2->data;
    sVar7 = kernel_tm2->elemsize;
    uVar30 = uVar24 & 0xffffffff;
    sVar8 = kernel_tm2->cstep;
    do {
      uVar25 = (uint)uVar24;
      pvVar23 = (void *)((ulong)((uVar25 & 3) + ((uint)(uVar24 >> 3) & 0x1fffffff) +
                                (uint)((uVar25 >> 2 & 1) != 0)) * sVar8 * sVar7 + (long)pvVar6);
      pAVar18 = (Allocator *)
                ((long)(_func_int ***)local_c8.data +
                CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) * local_c8.cstep *
                uVar30);
      lVar17 = 0;
      do {
        if (0 < inch) {
          uVar24 = 0;
          pAVar21 = pAVar18;
          do {
            *(undefined4 *)((long)pvVar23 + uVar24 * 4) = *(undefined4 *)&pAVar21->_vptr_Allocator;
            uVar24 = uVar24 + 1;
            pAVar21 = (Allocator *)
                      ((long)&pAVar21->_vptr_Allocator +
                      (long)local_c8.w *
                      CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
          } while (uVar20 != uVar24);
        }
        lVar17 = lVar17 + 1;
        pAVar18 = (Allocator *)((long)&pAVar18->_vptr_Allocator + 4);
        pvVar23 = (void *)((long)pvVar23 + (long)iVar14 * sVar7);
      } while (lVar17 != 0x24);
      uVar30 = uVar30 + 1;
      uVar24 = (ulong)(uVar25 + 1);
    } while (uVar30 != uVar29);
  }
  piVar13 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_c8.data != (Allocator *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd43_transform_kernel_sse(const Mat& kernel, Mat& kernel_tm2, int inch, int outch, const Option& opt)
{
    Mat kernel_tm(6 * 6, inch, outch);

    // G
    const float ktm[6][3] = {
        {1.0f / 4, 0.0f, 0.0f},
        {-1.0f / 6, -1.0f / 6, -1.0f / 6},
        {-1.0f / 6, 1.0f / 6, -1.0f / 6},
        {1.0f / 24, 1.0f / 12, 1.0f / 6},
        {1.0f / 24, -1.0f / 12, 1.0f / 6},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[6][3];
            for (int i = 0; i < 6; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 6; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 6; i++)
                {
                    kernel_tm0[j * 6 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }

    // interleave
    // src = 36-inch-outch
    // dst = inch-36-outch
#if __SSE2__
    kernel_tm2.create(8 * inch, 36, outch / 8 + (outch % 8) / 4 + outch % 4);
#else
    kernel_tm2.create(inch, 36, outch);
#endif

    int q = 0;
#if __SSE2__
    for (; q + 7 < outch; q += 8)
    {
        Mat g0 = kernel_tm2.channel(q / 8);

        for (int k = 0; k < 36; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p < inch; p++)
            {
                for (int i = 0; i < 8; i++)
                {
                    const float* k00 = kernel_tm.channel(q + i).row(p);
                    g00[0] = k00[k];
                    g00++;
                }
            }
        }
    }
    for (; q + 3 < outch; q += 4)
    {
        Mat g0 = kernel_tm2.channel(q / 8 + (q % 8) / 4);

        for (int k = 0; k < 36; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p < inch; p++)
            {
                for (int i = 0; i < 4; i++)
                {
                    const float* k00 = kernel_tm.channel(q + i).row(p);
                    g00[0] = k00[k];
                    g00++;
                }
            }
        }
    }
#endif
    for (; q < outch; q++)
    {
#if __SSE2__
        Mat g0 = kernel_tm2.channel(q / 8 + (q % 8) / 4 + q % 4);
#else
        Mat g0 = kernel_tm2.channel(q);
#endif

        for (int k = 0; k < 36; k++)
        {
            float* g00 = g0.row(k);

            for (int p = 0; p < inch; p++)
            {
                const float* k00 = kernel_tm.channel(q).row(p);
                g00[0] = k00[k];
                g00++;
            }
        }
    }
}